

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsSetContextData(JsContextRef context,void *data)

{
  bool bVar1;
  Data DVar2;
  undefined8 in_RAX;
  JsErrorCode JVar3;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  
  if (context == (JsContextRef)0x0) {
    JVar3 = JsErrorInvalidArgument;
  }
  else {
    local_28._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
    local_28.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
    local_28.hasException = true;
    DVar2 = ExceptionCheck::Save();
    local_28.__exceptionCheck.handledExceptionType = DVar2.handledExceptionType;
    bVar1 = JsrtContext::Is(context);
    JVar3 = JsErrorInvalidArgument;
    if (bVar1) {
      JVar3 = JsNoError;
      Memory::WriteBarrierPtr<void>::WriteBarrierSet
                ((WriteBarrierPtr<void> *)((long)context + 0x18),data);
    }
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
  }
  return JVar3;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsSetContextData(_In_ JsContextRef context, _In_ void *data)
{
    VALIDATE_JSREF(context);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!JsrtContext::Is(context))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        static_cast<JsrtContext *>(context)->SetExternalData(data);
    }